

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O3

int glu::TextureTestUtil::computeTextureLookupDiff
              (ConstPixelBufferAccess *result,ConstPixelBufferAccess *reference,
              PixelBufferAccess *errorMask,TextureCubeView *baseView,float *texCoord,
              ReferenceParams *sampleParams,LookupPrecision *lookupPrec,LodPrecision *lodPrec,
              qpWatchDog *watchDog)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [12];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  ReferenceParams *pRVar16;
  bool bVar17;
  int z;
  int faceSize;
  int y;
  ulong uVar18;
  int lodOffsNdx;
  long lVar19;
  uint uVar20;
  uint uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar43 [16];
  float fVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  float fVar75;
  undefined1 auVar74 [16];
  float fVar76;
  float fVar77;
  float fVar78;
  Vector<float,_2> res_1;
  Vec4 resPix;
  Vec3 triR [2];
  Vec3 triT [2];
  Vec3 triS [2];
  Vec2 lodBounds;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> srcLevelStorage;
  Vec2 lodO;
  Vec2 clampedLod;
  TextureCubeView src;
  ConstPixelBufferAccess local_478;
  ConstPixelBufferAccess *local_450;
  float local_448;
  float local_444;
  float local_440;
  float local_43c;
  undefined1 local_438 [8];
  float fStack_430;
  float fStack_42c;
  Vec3 local_428;
  Vec3 local_418;
  Vec3 local_408;
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  Vec4 local_3e8;
  float local_3d8 [8];
  float local_3b8 [8];
  float local_398 [6];
  PixelBufferAccess *local_380;
  ReferenceParams *local_378;
  ulong local_370;
  undefined1 local_368 [16];
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> local_358;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  undefined8 local_328;
  undefined8 uStack_320;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  undefined1 local_2f8 [8];
  float fStack_2f0;
  float fStack_2ec;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  ConstPixelBufferAccess *local_2d0;
  Sampler *local_2c8;
  tcu local_2c0 [8];
  undefined8 local_2b8;
  float local_2b0;
  Vec3 local_2a8;
  float local_298 [4];
  undefined8 local_288;
  undefined1 local_278 [16];
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined8 local_238;
  undefined8 uStack_230;
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  float local_1d8;
  uint uStack_1d4;
  uint uStack_1d0;
  uint uStack_1cc;
  float local_1c8;
  uint uStack_1c4;
  float fStack_1c0;
  uint uStack_1bc;
  undefined4 local_1b8;
  float fStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  undefined4 local_1a8;
  float fStack_1a4;
  undefined4 uStack_1a0;
  undefined4 uStack_19c;
  undefined1 local_198 [12];
  float fStack_18c;
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined1 local_118 [16];
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  undefined1 local_d8 [16];
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  TextureCubeView local_a8;
  undefined8 uStack_70;
  TextureCubeView local_68;
  undefined1 auVar42 [16];
  undefined1 auVar49 [16];
  undefined1 auVar54 [16];
  undefined1 auVar61 [16];
  undefined1 auVar65 [16];
  undefined1 auVar68 [16];
  
  local_358.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_358.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_358.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_380 = errorMask;
  local_2d0 = reference;
  getSubView(&local_a8,baseView,sampleParams->baseLevel,sampleParams->maxLevel);
  local_2c8 = &sampleParams->sampler;
  tcu::getEffectiveTextureView(&local_68,&local_a8,&local_358,local_2c8);
  local_398[0] = *texCoord;
  local_3b8[0] = texCoord[1];
  local_398[1] = texCoord[3];
  local_398[2] = texCoord[6];
  local_398[3] = texCoord[9];
  local_3b8[1] = texCoord[4];
  local_3b8[2] = texCoord[7];
  local_3b8[3] = texCoord[10];
  local_3d8[0] = texCoord[2];
  local_3d8[1] = texCoord[5];
  local_3d8[2] = texCoord[8];
  local_3d8[3] = texCoord[0xb];
  if (local_68.m_numLevels < 1) {
    faceSize = 0;
  }
  else {
    faceSize = (local_68.m_levels[0]->m_size).m_data[0];
  }
  _fStack_430 = 0;
  local_438 = (undefined1  [8])*(ulong *)(result->m_size).m_data;
  local_298[0] = (sampleParams->super_RenderParams).w.m_data[0];
  local_298[1] = (sampleParams->super_RenderParams).w.m_data[1];
  local_298[2] = (sampleParams->super_RenderParams).w.m_data[2];
  local_298[3] = (sampleParams->super_RenderParams).w.m_data[3];
  local_288 = CONCAT44(local_298[1],local_298[2]);
  local_368 = ZEXT816(0);
  if (((sampleParams->super_RenderParams).flags & 2) != 0) {
    local_368 = ZEXT416((uint)(sampleParams->super_RenderParams).bias);
  }
  local_a8.m_numLevels = -0x40800000;
  local_a8._4_4_ = 0;
  local_a8.m_levels[0] = (ConstPixelBufferAccess *)0x3f800000;
  local_a8.m_levels[1] = (ConstPixelBufferAccess *)0xbf80000000000000;
  local_a8.m_levels[2] = (ConstPixelBufferAccess *)0x3f80000000000000;
  local_a8.m_levels[3] = (ConstPixelBufferAccess *)0xbf800000bf800000;
  local_a8.m_levels[4] = (ConstPixelBufferAccess *)0x3f800000bf800000;
  local_a8.m_levels[5] = (ConstPixelBufferAccess *)0xbf8000003f800000;
  uStack_70 = 0x3f8000003f800000;
  local_478.m_format.order = 0xff00ff00;
  local_3d8[4] = local_3d8[2];
  local_3d8[5] = local_3d8[1];
  local_3b8[4] = local_3b8[2];
  local_3b8[5] = local_3b8[1];
  local_398[4] = local_398[2];
  local_398[5] = local_398[1];
  tcu::RGBA::toVec((RGBA *)&local_478);
  tcu::clear(local_380,&local_3e8);
  if ((result->m_size).m_data[1] < 1) {
    local_478.m_data = (void *)0x0;
  }
  else {
    local_308 = (float)(int)local_438._0_4_;
    local_318 = (float)(int)local_438._4_4_;
    fStack_300 = (float)(int)fStack_430;
    fStack_2fc = (float)(int)fStack_42c;
    local_368._4_4_ = local_368._0_4_;
    local_368._8_4_ = local_368._0_4_;
    local_368._12_4_ = local_368._0_4_;
    local_478.m_data = (void *)0x0;
    z = 0;
    local_450 = result;
    local_378 = sampleParams;
    fStack_314 = local_318;
    fStack_310 = local_318;
    fStack_30c = local_318;
    fStack_304 = local_318;
    local_1f8 = local_308;
    fStack_1f4 = local_308;
    fStack_1f0 = local_308;
    fStack_1ec = local_308;
    do {
      if (watchDog != (qpWatchDog *)0x0) {
        qpWatchDog_touch(watchDog);
      }
      if (0 < (local_450->m_size).m_data[0]) {
        fVar30 = (float)z + 0.5;
        auVar24._4_4_ = fStack_314;
        auVar24._0_4_ = local_318;
        auVar24._8_4_ = fStack_310;
        auVar24._12_4_ = fStack_30c;
        local_208 = ZEXT416((uint)(fVar30 / local_318));
        auVar74._0_4_ = fVar30 + 0.0625;
        auVar74._4_4_ = fVar30 + -0.0625;
        auVar74._8_4_ = fVar30 + 0.0;
        auVar74._12_4_ = fVar30 + 0.0;
        _local_1e8 = divps(auVar74,auVar24);
        local_278 = ZEXT416((uint)fVar30);
        local_218._4_12_ = auVar24._4_12_;
        local_218._0_4_ = local_318 - fVar30;
        local_228 = ZEXT416((uint)(1.0 - fVar30 / local_318));
        y = 0;
        do {
          tcu::ConstPixelBufferAccess::getPixel(&local_478,(int)local_450,y,z);
          pRVar16 = local_378;
          auVar22._0_4_ =
               (float)local_478.m_format.order - (local_378->super_RenderParams).colorBias.m_data[0]
          ;
          auVar22._4_4_ =
               (float)local_478.m_format.type - (local_378->super_RenderParams).colorBias.m_data[1];
          auVar22._8_4_ =
               (float)local_478.m_size.m_data[0] -
               (local_378->super_RenderParams).colorBias.m_data[2];
          auVar22._12_4_ =
               (float)local_478.m_size.m_data[1] -
               (local_378->super_RenderParams).colorBias.m_data[3];
          local_3e8.m_data =
               (float  [4])
               divps(auVar22,*(undefined1 (*) [16])(local_378->super_RenderParams).colorScale.m_data
                    );
          tcu::ConstPixelBufferAccess::getPixel(&local_478,(int)local_2d0,y,z);
          auVar23._0_4_ =
               (float)local_478.m_format.order - (pRVar16->super_RenderParams).colorBias.m_data[0];
          auVar23._4_4_ =
               (float)local_478.m_format.type - (pRVar16->super_RenderParams).colorBias.m_data[1];
          auVar23._8_4_ =
               (float)local_478.m_size.m_data[0] - (pRVar16->super_RenderParams).colorBias.m_data[2]
          ;
          auVar23._12_4_ =
               (float)local_478.m_size.m_data[1] - (pRVar16->super_RenderParams).colorBias.m_data[3]
          ;
          auVar24 = divps(auVar23,*(undefined1 (*) [16])
                                   (pRVar16->super_RenderParams).colorScale.m_data);
          fVar30 = local_3e8.m_data[0] - auVar24._0_4_;
          fVar33 = local_3e8.m_data[1] - auVar24._4_4_;
          fVar35 = local_3e8.m_data[2] - auVar24._8_4_;
          fVar36 = local_3e8.m_data[3] - auVar24._12_4_;
          auVar25._0_8_ = CONCAT44(fVar33,fVar30) ^ 0x8000000080000000;
          auVar25._8_4_ = -fVar35;
          auVar25._12_4_ = -fVar36;
          auVar71._4_4_ = fVar33;
          auVar71._0_4_ = fVar30;
          auVar71._8_4_ = fVar35;
          auVar71._12_4_ = fVar36;
          auVar24 = maxps(auVar25,auVar71);
          auVar26._4_4_ = -(uint)(auVar24._4_4_ <= (lookupPrec->colorThreshold).m_data[1]);
          auVar26._0_4_ = -(uint)(auVar24._0_4_ <= (lookupPrec->colorThreshold).m_data[0]);
          auVar26._8_4_ = -(uint)(auVar24._8_4_ <= (lookupPrec->colorThreshold).m_data[2]);
          auVar26._12_4_ = -(uint)(auVar24._12_4_ <= (lookupPrec->colorThreshold).m_data[3]);
          auVar24 = packssdw(auVar26,auVar26);
          auVar24 = packsswb(auVar24,auVar24);
          local_478.m_format.order = SUB164(auVar24 & _DAT_00639710,0);
          if (SUB161(auVar24 & _DAT_00639710,0) == '\0') {
LAB_004ff821:
            fVar30 = (float)y + 0.5;
            local_258 = ZEXT416((uint)fVar30);
            auVar27._0_4_ = fVar30 + 0.0625;
            auVar27._4_4_ = fVar30 + -0.0625;
            auVar27._8_4_ = fVar30 + 0.0;
            auVar27._12_4_ = fVar30 + 0.0;
            auVar12._4_4_ = fStack_1f4;
            auVar12._0_4_ = local_1f8;
            auVar12._8_4_ = fStack_1f0;
            auVar12._12_4_ = fStack_1ec;
            auVar24 = divps(auVar27,auVar12);
            local_268 = auVar24._0_4_ + (float)local_1e8._0_4_;
            fStack_264 = auVar24._4_4_ + (float)local_1e8._4_4_;
            fStack_260 = auVar24._8_4_ + fStack_1e0;
            fStack_25c = auVar24._12_4_ + fStack_1dc;
            if ((fStack_264 <= 1.0) || (1.0 <= local_268)) {
              uVar18 = (ulong)(1.0 < fStack_264);
              fStack_1a4 = fVar30 / local_308;
              local_1c8 = local_308 - fVar30;
              uStack_1c4 = local_218._0_4_;
              fStack_1c0 = fStack_304;
              uStack_1bc = local_218._4_4_;
              fStack_1b4 = 1.0 - fStack_1a4;
              uStack_1d4 = local_278._0_4_;
              uStack_1d0 = 0;
              uStack_1cc = 0;
              local_1a8 = local_208._0_4_;
              uStack_1a0 = local_208._8_4_;
              uStack_19c = local_208._12_4_;
              local_1b8 = local_228._0_4_;
              uStack_1b0 = local_228._8_4_;
              uStack_1ac = local_228._12_4_;
              local_1d8 = fVar30;
              do {
                local_2f8._0_4_ = (int)((uint)(uVar18 == 0) << 0x1f) >> 0x1f;
                local_2f8._4_4_ = (int)((uint)(uVar18 == 0) << 0x1f) >> 0x1f;
                register0x000012c8 = 0;
                local_238 = *(ulong *)(local_298 + uVar18 * 3);
                fVar76 = (float)local_238;
                fStack_144 = (float)(local_238 >> 0x20);
                auVar45._8_8_ = 0;
                auVar45._0_8_ = *(ulong *)(local_298 + uVar18 * 3 + 1);
                local_2e8 = local_298[uVar18 * 3 + 2];
                auVar13._4_4_ = fStack_1b4;
                auVar13._0_4_ = local_1b8;
                auVar13._8_4_ = uStack_1b0;
                auVar13._12_4_ = uStack_1ac;
                auVar14._4_4_ = fStack_1a4;
                auVar14._0_4_ = local_1a8;
                auVar14._8_4_ = uStack_1a0;
                auVar14._12_4_ = uStack_19c;
                auVar74 = auVar14 & _local_2f8 | ~_local_2f8 & auVar13;
                fVar69 = auVar74._0_4_;
                fVar75 = auVar74._4_4_;
                fVar31 = (1.0 - fVar75) - fVar69;
                auVar24 = divps(auVar74,auVar45);
                auVar39._4_4_ = auVar24._4_4_;
                auVar39._0_4_ = auVar39._4_4_;
                auVar39._8_4_ = auVar39._4_4_;
                auVar39._12_4_ = auVar39._4_4_;
                auVar40._4_12_ = auVar39._4_12_;
                auVar40._0_4_ = auVar39._4_4_ + fVar31 / fVar76 + auVar24._0_4_;
                fVar30 = local_3b8[uVar18 * 3 + 1];
                _local_438 = ZEXT416((uint)fVar30);
                fVar33 = local_3d8[uVar18 * 3];
                local_478.m_pitch.m_data[2] = (int)local_3d8[uVar18 * 3 + 1];
                fVar35 = local_3d8[uVar18 * 3 + 2];
                fVar36 = local_398[uVar18 * 3];
                _local_198 = ZEXT416((uint)fVar36);
                auVar70._0_4_ = fVar36 * fVar31;
                auVar70._4_4_ = fVar30 * fVar69;
                auVar70._8_4_ = auVar74._8_4_ * 0.0;
                auVar70._12_4_ = auVar74._12_4_ * 0.0;
                fVar77 = local_3b8[uVar18 * 3];
                fVar78 = local_398[uVar18 * 3 + 1];
                local_c8 = CONCAT44(fVar77,fVar78);
                uStack_c0 = 0;
                auVar56._0_4_ = fVar69 * fVar78;
                auVar56._4_4_ = fVar31 * fVar77;
                auVar56._8_4_ = auVar74._8_4_ * 0.0;
                auVar56._12_4_ = auVar74._12_4_ * 0.0;
                local_b8 = CONCAT44(fVar76,fStack_144);
                uStack_b0 = 0;
                auVar3._4_4_ = fVar76;
                auVar3._0_4_ = fStack_144;
                auVar3._8_8_ = 0;
                auVar24 = divps(auVar56,auVar3);
                auVar5._8_8_ = 0;
                auVar5._0_8_ = local_238;
                auVar71 = divps(auVar70,auVar5);
                fVar32 = local_398[uVar18 * 3 + 2];
                fVar34 = local_3b8[uVar18 * 3 + 2];
                auVar57._0_4_ = fVar75 * fVar32;
                auVar57._4_4_ = fVar75 * fVar34;
                auVar57._8_4_ = fVar75 * 0.0;
                auVar57._12_4_ = fVar75 * 0.0;
                auVar2._4_4_ = local_2e8;
                auVar2._0_4_ = local_2e8;
                auVar2._8_4_ = local_2e8;
                auVar2._12_4_ = local_2e8;
                auVar74 = divps(auVar57,auVar2);
                auVar58._0_4_ = auVar74._0_4_ + auVar71._0_4_ + auVar24._0_4_;
                auVar58._4_4_ = auVar74._4_4_ + auVar71._4_4_ + auVar24._4_4_;
                auVar58._8_4_ = auVar74._8_4_ + auVar71._8_4_ + auVar24._8_4_;
                auVar58._12_4_ = auVar74._12_4_ + auVar71._12_4_ + auVar24._12_4_;
                local_478.m_size.m_data[0] =
                     (int)(((fVar75 * fVar35) / local_2e8 +
                           (fVar69 * (float)local_478.m_pitch.m_data[2]) / fStack_144 +
                           (fVar31 * fVar33) / fVar76) / auVar40._0_4_);
                auVar42._0_8_ = auVar40._0_8_;
                auVar42._8_4_ = auVar39._4_4_;
                auVar42._12_4_ = auVar39._4_4_;
                auVar41._8_8_ = auVar42._8_8_;
                auVar41._4_4_ = auVar40._0_4_;
                auVar41._0_4_ = auVar40._0_4_;
                auVar24 = divps(auVar58,auVar41);
                local_478.m_format = auVar24._0_8_;
                auVar9._4_4_ = fStack_304;
                auVar9._0_4_ = local_308;
                auVar9._8_4_ = fStack_300;
                auVar9._12_4_ = fStack_2fc;
                local_d8 = ZEXT416((uint)(local_2e8 * local_308));
                local_e8 = fStack_144 * local_2e8;
                fVar44 = fVar69 + -1.0;
                auVar59._4_12_ = auVar9._4_12_;
                fVar55 = (local_308 * fVar44 + (float)local_258._0_4_) * local_e8 -
                         (local_2e8 * local_308 * fVar69 + (float)local_258._0_4_ * fStack_144) *
                         fVar76;
                local_f8 = (fVar78 - fVar36) * local_2e8 + (fVar32 - fVar78) * fVar76;
                fStack_f4 = (fVar30 - fVar77) * local_2e8 + (fVar34 - fVar30) * fVar76;
                fStack_f0 = local_2e8 * 0.0 + fVar76 * 0.0;
                fStack_ec = local_2e8 * 0.0 + fVar76 * 0.0;
                local_43c = ((float)local_478.m_pitch.m_data[2] - fVar33) * local_2e8 +
                            (fVar35 - (float)local_478.m_pitch.m_data[2]) * fVar76;
                local_440 = (fVar33 - fVar35) * fStack_144;
                local_108 = (fVar36 - fVar32) * fStack_144;
                fStack_104 = (fVar77 - fVar34) * fStack_144;
                fStack_100 = fStack_144 * 0.0;
                fStack_fc = fStack_144 * 0.0;
                fVar31 = fVar76 * fStack_144 * local_2e8;
                local_138 = fVar31 * local_308;
                auVar59._0_4_ = fVar55 * fVar55;
                local_408.m_data[2] =
                     ((local_440 * fVar44 + fVar69 * local_43c) * local_138) / auVar59._0_4_;
                local_128 = CONCAT44(fStack_144,local_138);
                uStack_120 = 0;
                auVar46._0_4_ = (fVar44 * local_108 + fVar69 * local_f8) * local_138;
                auVar46._4_4_ = (fVar44 * fStack_104 + fVar69 * fStack_f4) * local_138;
                auVar46._8_4_ = (fVar75 * fStack_100 + fVar69 * fStack_f0) * local_138;
                auVar46._12_4_ = (fVar75 * fStack_fc + fVar69 * fStack_ec) * local_138;
                auVar61._0_8_ = auVar59._0_8_;
                auVar61._8_4_ = fStack_304;
                auVar61._12_4_ = fStack_304;
                auVar60._8_8_ = auVar61._8_8_;
                auVar60._4_4_ = auVar59._0_4_;
                auVar60._0_4_ = auVar59._0_4_;
                auVar24 = divps(auVar46,auVar60);
                local_408.m_data._0_8_ = auVar24._0_8_;
                auVar7._4_4_ = fStack_314;
                auVar7._0_4_ = local_318;
                auVar7._8_4_ = fStack_310;
                auVar7._12_4_ = fStack_30c;
                local_148 = fStack_144 * local_318;
                local_248 = ZEXT416((uint)local_2e8);
                fVar44 = fVar75 + -1.0;
                auVar47._4_12_ = auVar7._4_12_;
                fVar55 = (local_318 * fVar44 + (float)local_278._0_4_) * local_e8 -
                         (local_148 * fVar75 + (float)local_278._0_4_ * local_2e8) * fVar76;
                local_328 = CONCAT44(fVar34,fVar32);
                uStack_320 = 0;
                local_158 = (fVar78 - fVar32) * fVar76 + (fVar32 - fVar36) * fStack_144;
                fStack_154 = (fVar30 - fVar34) * fVar76 + (fVar34 - fVar77) * fStack_144;
                fStack_150 = fVar76 * 0.0 + fStack_144 * 0.0;
                fStack_14c = fVar76 * 0.0 + fStack_144 * 0.0;
                fStack_3f4 = fStack_144;
                local_3f8 = fStack_144;
                fStack_3f0 = fStack_144;
                fStack_3ec = fStack_144;
                uStack_230 = 0;
                local_444 = ((float)local_478.m_pitch.m_data[2] - fVar35) * fVar76 +
                            (fVar35 - fVar33) * fStack_144;
                local_448 = (fVar33 - (float)local_478.m_pitch.m_data[2]) * local_2e8;
                local_338 = (fVar36 - fVar78) * local_2e8;
                fStack_334 = (fVar77 - fVar30) * local_2e8;
                fStack_330 = local_2e8 * 0.0;
                fStack_32c = local_2e8 * 0.0;
                local_118._0_4_ = fVar31 * local_318;
                local_118._4_8_ = local_238 >> 0x20;
                local_118._12_4_ = 0;
                auVar47._0_4_ = fVar55 * fVar55;
                local_2a8.m_data[2] =
                     ((local_448 * fVar44 + fVar75 * local_444) * (float)local_118._0_4_) /
                     auVar47._0_4_;
                auVar37._0_4_ = (fVar44 * local_338 + fVar75 * local_158) * (float)local_118._0_4_;
                auVar37._4_4_ = (fVar44 * fStack_334 + fVar75 * fStack_154) * (float)local_118._0_4_
                ;
                auVar37._8_4_ = (fVar75 * fStack_330 + fVar75 * fStack_150) * (float)local_118._0_4_
                ;
                auVar37._12_4_ =
                     (fVar75 * fStack_32c + fVar75 * fStack_14c) * (float)local_118._0_4_;
                auVar49._0_8_ = auVar47._0_8_;
                auVar49._8_4_ = fStack_314;
                auVar49._12_4_ = fStack_314;
                auVar48._8_8_ = auVar49._8_8_;
                auVar48._4_4_ = auVar47._0_4_;
                auVar48._0_4_ = auVar47._0_4_;
                auVar24 = divps(auVar37,auVar48);
                local_2a8.m_data._0_8_ = auVar24._0_8_;
                fStack_2e4 = local_2e8;
                fStack_2e0 = local_2e8;
                fStack_2dc = local_2e8;
                local_168 = (float)local_118._0_4_;
                fStack_164 = (float)local_118._0_4_;
                fStack_160 = (float)local_118._0_4_;
                fStack_15c = (float)local_118._0_4_;
                fStack_140 = fStack_144;
                fStack_13c = fStack_144;
                fStack_134 = local_138;
                fStack_130 = local_138;
                fStack_12c = local_138;
                fStack_e4 = fStack_144;
                fStack_e0 = fStack_144;
                fStack_dc = fStack_144;
                tcu::computeCubeLodBoundsFromDerivates
                          ((tcu *)&local_370,(Vec3 *)&local_478,&local_408,&local_2a8,faceSize,
                           lodPrec);
                local_2f8._0_4_ =
                     ~local_2f8._0_4_ & (uint)local_1c8 | (uint)local_1d8 & local_2f8._0_4_;
                local_2f8._4_4_ = ~local_2f8._4_4_ & uStack_1c4 | uStack_1d4 & local_2f8._4_4_;
                fStack_2f0 = (float)(~(uint)fStack_2f0 & (uint)fStack_1c0 |
                                    uStack_1d0 & (uint)fStack_2f0);
                fStack_2ec = (float)(~(uint)fStack_2ec & uStack_1bc | uStack_1cc & (uint)fStack_2ec)
                ;
                local_178._0_8_ = local_238 ^ 0x8000000080000000;
                local_178._8_4_ = (uint)uStack_230 ^ 0x80000000;
                local_178._12_4_ = uStack_230._4_4_ ^ 0x80000000;
                auVar6._4_8_ = local_178._8_8_;
                auVar6._0_4_ = local_238._4_4_;
                auVar28._0_8_ = auVar6._0_8_ << 0x20;
                auVar28._8_4_ = (uint)uStack_230;
                auVar28._12_4_ = uStack_230._4_4_;
                local_188._4_12_ = auVar28._4_12_;
                local_188._0_4_ = local_248._0_4_;
                fVar30 = (float)local_438._0_4_;
                lVar19 = 0;
                local_438._4_4_ = local_438._0_4_;
                local_438._0_4_ = local_198._0_4_;
                fStack_430 = (float)local_198._8_4_;
                fStack_42c = fStack_18c;
                fVar36 = (float)local_198._0_4_;
                fVar77 = (float)local_198._8_4_;
                fVar78 = fStack_18c;
                fVar32 = (float)local_2f8._0_4_;
                fVar34 = (float)local_2f8._4_4_;
                fVar31 = fStack_2f0;
                fVar44 = fStack_2ec;
                do {
                  fVar32 = SUB84(local_a8.m_levels[lVar19 + -1],0) + fVar32;
                  fVar34 = (float)((ulong)local_a8.m_levels[lVar19 + -1] >> 0x20) + fVar34;
                  auVar29._4_4_ = fVar34;
                  auVar29._0_4_ = fVar32;
                  auVar29._8_4_ = fVar31 + 0.0;
                  auVar29._12_4_ = fVar44 + 0.0;
                  auVar10._4_4_ = fStack_304;
                  auVar10._0_4_ = local_308;
                  auVar10._8_4_ = fStack_300;
                  auVar10._12_4_ = fStack_2fc;
                  auVar24 = divps(auVar29,auVar10);
                  fVar31 = auVar24._0_4_;
                  fVar44 = auVar24._4_4_;
                  fVar55 = (1.0 - fVar31) - fVar44;
                  auVar24 = divps(auVar24,local_188);
                  fVar69 = auVar24._4_4_;
                  auVar62._4_4_ = fVar69;
                  auVar62._0_4_ = fVar69;
                  auVar62._8_4_ = fVar69;
                  auVar62._12_4_ = fVar69;
                  auVar63._4_12_ = auVar62._4_12_;
                  auVar63._0_4_ = fVar69 + fVar55 / (float)local_238 + auVar24._0_4_;
                  local_2b0 = ((fVar35 * fVar31) / (float)local_248._0_4_ +
                              ((float)local_478.m_pitch.m_data[2] * fVar44) / local_3f8 +
                              (fVar33 * fVar55) / (float)local_238) / auVar63._0_4_;
                  auVar38._0_4_ = fVar44 * (float)local_c8;
                  auVar38._4_4_ = fVar55 * local_c8._4_4_;
                  auVar38._8_4_ = fVar44 * (float)uStack_c0;
                  auVar38._12_4_ = fVar44 * uStack_c0._4_4_;
                  auVar15._8_8_ = uStack_b0;
                  auVar15._0_8_ = local_b8;
                  auVar24 = divps(auVar38,auVar15);
                  auVar50._0_4_ = fVar55 * fVar36;
                  auVar50._4_4_ = fVar44 * fVar30;
                  auVar50._8_4_ = fVar44 * fVar77;
                  auVar50._12_4_ = fVar44 * fVar78;
                  auVar4._4_4_ = local_238._4_4_;
                  auVar4._0_4_ = (float)local_238;
                  auVar4._8_4_ = (uint)uStack_230;
                  auVar4._12_4_ = uStack_230._4_4_;
                  auVar74 = divps(auVar50,auVar4);
                  auVar72._0_4_ = (float)local_328 * fVar31;
                  auVar72._4_4_ = local_328._4_4_ * fVar31;
                  auVar72._8_4_ = (float)uStack_320 * fVar31;
                  auVar72._12_4_ = uStack_320._4_4_ * fVar31;
                  auVar11._4_4_ = fStack_2e4;
                  auVar11._0_4_ = local_2e8;
                  auVar11._8_4_ = fStack_2e0;
                  auVar11._12_4_ = fStack_2dc;
                  auVar71 = divps(auVar72,auVar11);
                  auVar73._0_4_ = auVar71._0_4_ + auVar74._0_4_ + auVar24._0_4_;
                  auVar73._4_4_ = auVar71._4_4_ + auVar74._4_4_ + auVar24._4_4_;
                  auVar73._8_4_ = auVar71._8_4_ + auVar74._8_4_ + auVar24._8_4_;
                  auVar73._12_4_ = auVar71._12_4_ + auVar74._12_4_ + auVar24._12_4_;
                  auVar65._0_8_ = auVar63._0_8_;
                  auVar65._8_4_ = fVar69;
                  auVar65._12_4_ = fVar69;
                  auVar64._8_8_ = auVar65._8_8_;
                  auVar64._4_4_ = auVar63._0_4_;
                  auVar64._0_4_ = auVar63._0_4_;
                  auVar24 = divps(auVar73,auVar64);
                  local_2b8 = auVar24._0_8_;
                  fVar30 = fVar44 + -1.0;
                  auVar66._4_12_ = auVar10._4_12_;
                  fVar36 = (local_308 * fVar30 + fVar32) * local_e8 +
                           ((float)local_d8._0_4_ * fVar44 + local_3f8 * fVar32) *
                           (float)local_178._0_4_;
                  auVar66._0_4_ = fVar36 * fVar36;
                  local_418.m_data[2] =
                       ((local_440 * fVar30 + local_43c * fVar44) * (float)local_128) /
                       auVar66._0_4_;
                  auVar51._0_4_ = (fVar30 * local_108 + fVar44 * local_f8) * local_138;
                  auVar51._4_4_ = (fVar30 * fStack_104 + fVar44 * fStack_f4) * fStack_134;
                  auVar51._8_4_ = (fVar44 * fStack_100 + fVar44 * fStack_f0) * fStack_130;
                  auVar51._12_4_ = (fVar44 * fStack_fc + fVar44 * fStack_ec) * fStack_12c;
                  auVar68._0_8_ = auVar66._0_8_;
                  auVar68._8_4_ = fStack_304;
                  auVar68._12_4_ = fStack_304;
                  auVar67._8_8_ = auVar68._8_8_;
                  auVar67._4_4_ = auVar66._0_4_;
                  auVar67._0_4_ = auVar66._0_4_;
                  auVar24 = divps(auVar51,auVar67);
                  local_418.m_data._0_8_ = auVar24._0_8_;
                  fVar30 = fVar31 + -1.0;
                  auVar8._4_4_ = fStack_314;
                  auVar8._0_4_ = local_318;
                  auVar8._8_4_ = fStack_310;
                  auVar8._12_4_ = fStack_30c;
                  auVar52._4_12_ = auVar8._4_12_;
                  fVar36 = (local_318 * fVar30 + fVar34) * local_e8 +
                           (local_148 * fVar31 + fVar34 * (float)local_248._0_4_) *
                           (float)local_178._0_4_;
                  auVar52._0_4_ = fVar36 * fVar36;
                  local_428.m_data[2] =
                       ((local_448 * fVar30 + fVar31 * local_444) * (float)local_118._0_4_) /
                       auVar52._0_4_;
                  auVar43._0_4_ = (fVar30 * local_338 + fVar31 * local_158) * local_168;
                  auVar43._4_4_ = (fVar30 * fStack_334 + fVar31 * fStack_154) * fStack_164;
                  auVar43._8_4_ = (fVar44 * fStack_330 + fVar31 * fStack_150) * fStack_160;
                  auVar43._12_4_ = (fVar44 * fStack_32c + fVar31 * fStack_14c) * fStack_15c;
                  auVar54._0_8_ = auVar52._0_8_;
                  auVar54._8_4_ = fStack_314;
                  auVar54._12_4_ = fStack_314;
                  auVar53._8_8_ = auVar54._8_8_;
                  auVar53._4_4_ = auVar52._0_4_;
                  auVar53._0_4_ = auVar52._0_4_;
                  auVar24 = divps(auVar43,auVar53);
                  local_428.m_data._0_8_ = auVar24._0_8_;
                  tcu::computeCubeLodBoundsFromDerivates
                            (local_2c0,(Vec3 *)&local_2b8,&local_418,&local_428,faceSize,lodPrec);
                  fVar30 = (float)(local_370 >> 0x20);
                  uVar20 = -(uint)((float)local_370 <= local_2c0._0_4_);
                  uVar21 = -(uint)(local_2c0._4_4_ <= fVar30);
                  local_370 = CONCAT44(~uVar21 & (uint)local_2c0._4_4_,
                                       ~uVar20 & (uint)local_2c0._0_4_) |
                              CONCAT44((uint)fVar30 & uVar21,(uint)(float)local_370 & uVar20);
                  lVar19 = lVar19 + 1;
                  fVar36 = (float)local_438._0_4_;
                  fVar30 = (float)local_438._4_4_;
                  fVar77 = fStack_430;
                  fVar78 = fStack_42c;
                  fVar32 = (float)local_2f8._0_4_;
                  fVar34 = (float)local_2f8._4_4_;
                  fVar31 = fStack_2f0;
                  fVar44 = fStack_2ec;
                } while (lVar19 != 8);
                local_418.m_data[0] = (float)local_370 + (float)local_368._0_4_;
                local_418.m_data[1] = (float)(local_370 >> 0x20) + (float)local_368._4_4_;
                local_428.m_data[0] = local_378->minLod;
                local_428.m_data[1] = local_378->maxLod;
                tcu::clampLodBounds((tcu *)&local_2b8,(Vec2 *)&local_418,(Vec2 *)&local_428,lodPrec)
                ;
                bVar17 = tcu::isLookupResultValid
                                   (&local_68,local_2c8,lookupPrec,(Vec3 *)&local_478,
                                    (Vec2 *)&local_2b8,&local_3e8);
                if (bVar17) goto LAB_004ff8c1;
              } while ((uVar18 == 0) && (uVar18 = 1, 1.0 <= local_268));
            }
            local_408.m_data[0] = -1.7014636e+38;
            tcu::RGBA::toVec((RGBA *)&local_408);
            tcu::PixelBufferAccess::setPixel(local_380,(Vec4 *)&local_478,y,z,0);
            local_478.m_data = (void *)(ulong)((int)local_478.m_data + 1);
          }
          else {
            uVar18 = 0xffffffffffffffff;
            do {
              if (uVar18 == 2) goto LAB_004ff8c1;
              uVar1 = uVar18 + 1;
              lVar19 = uVar18 - 6;
              uVar18 = uVar1;
            } while (*(char *)((long)local_478.m_size.m_data + lVar19) != '\0');
            if (uVar1 < 3) goto LAB_004ff821;
          }
LAB_004ff8c1:
          y = y + 1;
        } while (y < (local_450->m_size).m_data[0]);
      }
      z = z + 1;
    } while (z < (local_450->m_size).m_data[1]);
  }
  if (local_358.
      super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_358.
                    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_358.
                          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_358.
                          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return (int)local_478.m_data;
}

Assistant:

int computeTextureLookupDiff (const tcu::ConstPixelBufferAccess&	result,
							  const tcu::ConstPixelBufferAccess&	reference,
							  const tcu::PixelBufferAccess&			errorMask,
							  const tcu::TextureCubeView&			baseView,
							  const float*							texCoord,
							  const ReferenceParams&				sampleParams,
							  const tcu::LookupPrecision&			lookupPrec,
							  const tcu::LodPrecision&				lodPrec,
							  qpWatchDog*							watchDog)
{
	DE_ASSERT(result.getWidth() == reference.getWidth() && result.getHeight() == reference.getHeight());
	DE_ASSERT(result.getWidth() == errorMask.getWidth() && result.getHeight() == errorMask.getHeight());

	std::vector<tcu::ConstPixelBufferAccess>	srcLevelStorage;
	const tcu::TextureCubeView					src					= getEffectiveTextureView(getSubView(baseView, sampleParams.baseLevel, sampleParams.maxLevel), srcLevelStorage, sampleParams.sampler);

	const tcu::Vec4								sq					= tcu::Vec4(texCoord[0+0], texCoord[3+0], texCoord[6+0], texCoord[9+0]);
	const tcu::Vec4								tq					= tcu::Vec4(texCoord[0+1], texCoord[3+1], texCoord[6+1], texCoord[9+1]);
	const tcu::Vec4								rq					= tcu::Vec4(texCoord[0+2], texCoord[3+2], texCoord[6+2], texCoord[9+2]);

	const tcu::IVec2							dstSize				= tcu::IVec2(result.getWidth(), result.getHeight());
	const float									dstW				= float(dstSize.x());
	const float									dstH				= float(dstSize.y());
	const int									srcSize				= src.getSize();

	// Coordinates per triangle.
	const tcu::Vec3								triS[2]				= { sq.swizzle(0, 1, 2), sq.swizzle(3, 2, 1) };
	const tcu::Vec3								triT[2]				= { tq.swizzle(0, 1, 2), tq.swizzle(3, 2, 1) };
	const tcu::Vec3								triR[2]				= { rq.swizzle(0, 1, 2), rq.swizzle(3, 2, 1) };
	const tcu::Vec3								triW[2]				= { sampleParams.w.swizzle(0, 1, 2), sampleParams.w.swizzle(3, 2, 1) };

	const tcu::Vec2								lodBias				((sampleParams.flags & ReferenceParams::USE_BIAS) ? sampleParams.bias : 0.0f);

	const float									posEps				= 1.0f / float(1<<MIN_SUBPIXEL_BITS);

	int											numFailed			= 0;

	const tcu::Vec2 lodOffsets[] =
	{
		tcu::Vec2(-1,  0),
		tcu::Vec2(+1,  0),
		tcu::Vec2( 0, -1),
		tcu::Vec2( 0, +1),

		// \note Not strictly allowed by spec, but implementations do this in practice.
		tcu::Vec2(-1, -1),
		tcu::Vec2(-1, +1),
		tcu::Vec2(+1, -1),
		tcu::Vec2(+1, +1),
	};

	tcu::clear(errorMask, tcu::RGBA::green().toVec());

	for (int py = 0; py < result.getHeight(); py++)
	{
		// Ugly hack, validation can take way too long at the moment.
		if (watchDog)
			qpWatchDog_touch(watchDog);

		for (int px = 0; px < result.getWidth(); px++)
		{
			const tcu::Vec4	resPix	= (result.getPixel(px, py)		- sampleParams.colorBias) / sampleParams.colorScale;
			const tcu::Vec4	refPix	= (reference.getPixel(px, py)	- sampleParams.colorBias) / sampleParams.colorScale;

			// Try comparison to ideal reference first, and if that fails use slower verificator.
			if (!tcu::boolAll(tcu::lessThanEqual(tcu::abs(resPix - refPix), lookupPrec.colorThreshold)))
			{
				const float		wx		= (float)px + 0.5f;
				const float		wy		= (float)py + 0.5f;
				const float		nx		= wx / dstW;
				const float		ny		= wy / dstH;

				const bool		tri0	= (wx-posEps)/dstW + (wy-posEps)/dstH <= 1.0f;
				const bool		tri1	= (wx+posEps)/dstW + (wy+posEps)/dstH >= 1.0f;

				bool			isOk	= false;

				DE_ASSERT(tri0 || tri1);

				// Pixel can belong to either of the triangles if it lies close enough to the edge.
				for (int triNdx = (tri0?0:1); triNdx <= (tri1?1:0); triNdx++)
				{
					const float		triWx	= triNdx ? dstW - wx : wx;
					const float		triWy	= triNdx ? dstH - wy : wy;
					const float		triNx	= triNdx ? 1.0f - nx : nx;
					const float		triNy	= triNdx ? 1.0f - ny : ny;

					const tcu::Vec3	coord		(projectedTriInterpolate(triS[triNdx], triW[triNdx], triNx, triNy),
												 projectedTriInterpolate(triT[triNdx], triW[triNdx], triNx, triNy),
												 projectedTriInterpolate(triR[triNdx], triW[triNdx], triNx, triNy));
					const tcu::Vec3	coordDx		(triDerivateX(triS[triNdx], triW[triNdx], wx, dstW, triNy),
												 triDerivateX(triT[triNdx], triW[triNdx], wx, dstW, triNy),
												 triDerivateX(triR[triNdx], triW[triNdx], wx, dstW, triNy));
					const tcu::Vec3	coordDy		(triDerivateY(triS[triNdx], triW[triNdx], wy, dstH, triNx),
												 triDerivateY(triT[triNdx], triW[triNdx], wy, dstH, triNx),
												 triDerivateY(triR[triNdx], triW[triNdx], wy, dstH, triNx));

					tcu::Vec2		lodBounds	= tcu::computeCubeLodBoundsFromDerivates(coord, coordDx, coordDy, srcSize, lodPrec);

					// Compute lod bounds across lodOffsets range.
					for (int lodOffsNdx = 0; lodOffsNdx < DE_LENGTH_OF_ARRAY(lodOffsets); lodOffsNdx++)
					{
						const float		wxo		= triWx + lodOffsets[lodOffsNdx].x();
						const float		wyo		= triWy + lodOffsets[lodOffsNdx].y();
						const float		nxo		= wxo/dstW;
						const float		nyo		= wyo/dstH;

						const tcu::Vec3	coordO		(projectedTriInterpolate(triS[triNdx], triW[triNdx], nxo, nyo),
													 projectedTriInterpolate(triT[triNdx], triW[triNdx], nxo, nyo),
													 projectedTriInterpolate(triR[triNdx], triW[triNdx], nxo, nyo));
						const tcu::Vec3	coordDxo	(triDerivateX(triS[triNdx], triW[triNdx], wxo, dstW, nyo),
													 triDerivateX(triT[triNdx], triW[triNdx], wxo, dstW, nyo),
													 triDerivateX(triR[triNdx], triW[triNdx], wxo, dstW, nyo));
						const tcu::Vec3	coordDyo	(triDerivateY(triS[triNdx], triW[triNdx], wyo, dstH, nxo),
													 triDerivateY(triT[triNdx], triW[triNdx], wyo, dstH, nxo),
													 triDerivateY(triR[triNdx], triW[triNdx], wyo, dstH, nxo));
						const tcu::Vec2	lodO		= tcu::computeCubeLodBoundsFromDerivates(coordO, coordDxo, coordDyo, srcSize, lodPrec);

						lodBounds.x() = de::min(lodBounds.x(), lodO.x());
						lodBounds.y() = de::max(lodBounds.y(), lodO.y());
					}

					const tcu::Vec2	clampedLod	= tcu::clampLodBounds(lodBounds + lodBias, tcu::Vec2(sampleParams.minLod, sampleParams.maxLod), lodPrec);

					if (tcu::isLookupResultValid(src, sampleParams.sampler, lookupPrec, coord, clampedLod, resPix))
					{
						isOk = true;
						break;
					}
				}

				if (!isOk)
				{
					errorMask.setPixel(tcu::RGBA::red().toVec(), px, py);
					numFailed += 1;
				}
			}
		}
	}

	return numFailed;
}